

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.h
# Opt level: O2

VariableDatum * __thiscall DIS::VariableDatum::operator=(VariableDatum *this,VariableDatum *param_1)

{
  uint uVar1;
  
  uVar1 = param_1->_variableDatumLength;
  this->_variableDatumID = param_1->_variableDatumID;
  this->_variableDatumLength = uVar1;
  std::vector<char,_std::allocator<char>_>::operator=
            (&this->_variableDatums,&param_1->_variableDatums);
  this->_arrayLength = param_1->_arrayLength;
  return this;
}

Assistant:

class OPENDIS6_EXPORT VariableDatum
{
protected:
  /** ID of the variable datum */
  unsigned int _variableDatumID;

  /** length of the variable datums */
  unsigned int _variableDatumLength;

  /** The variable datum data.*/
  std::vector<char> _variableDatums;
  unsigned int _arrayLength;


 public:
    VariableDatum();
    virtual ~VariableDatum();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned int getVariableDatumID() const;
    void setVariableDatumID(unsigned int pX);

    unsigned int getVariableDatumLength() const;
    void setVariableDatumLength(unsigned int pX);

    char*  getVariableDatums();
    const char*  getVariableDatums() const;
    void setVariableDatums(const char* pX, const unsigned int length);


virtual unsigned int getMarshalledSize() const;

     bool operator  ==(const VariableDatum& rhs) const;
}